

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O1

Image * ImageIO::readImage(string *fileName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  int iVar3;
  FILE *pFVar4;
  uchar *imageInfo;
  int *piVar5;
  ostream *poVar6;
  uchar *data;
  Image *this;
  undefined8 uVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  int i_1;
  long lVar8;
  int i;
  long lVar9;
  char *__nptr;
  uint dataSize;
  bool bVar10;
  string bmpStr;
  string imageHeightStr;
  string imageWidthStr;
  string local_d0;
  long local_b0;
  long local_a8;
  char *local_a0;
  undefined8 local_98;
  char local_90 [16];
  char *local_80;
  undefined8 local_78;
  char local_70 [16];
  char *local_60;
  size_t local_58;
  char local_50 [16];
  FILE *local_40;
  string *local_38;
  
  local_38 = fileName;
  pFVar4 = fopen((fileName->_M_dataplus)._M_p,"rb+");
  if (pFVar4 == (FILE *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_87c9);
    std::endl<char,std::char_traits<char>>(poVar6);
    exit(1);
  }
  imageInfo = (uchar *)operator_new__(0x36);
  local_40 = pFVar4;
  fread(imageInfo,1,0x36,pFVar4);
  local_80 = local_70;
  local_78 = 0;
  local_70[0] = '\0';
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = '\0';
  lVar9 = 0x12;
  paVar1 = &local_d0.field_2;
  uVar7 = extraout_RDX;
  do {
    Tools::Char2Hex_abi_cxx11_(&local_d0,(Tools *)(ulong)imageInfo[lVar9],(uchar)uVar7);
    std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
    uVar7 = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
      uVar7 = extraout_RDX_01;
    }
    __nptr = local_80;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x16);
  piVar5 = __errno_location();
  iVar3 = *piVar5;
  *piVar5 = 0;
  lVar9 = strtol(__nptr,(char **)&local_d0,0x10);
  if (local_d0._M_dataplus._M_p == __nptr) {
    std::__throw_invalid_argument("stoi");
LAB_001030cc:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar9 != lVar9) || (*piVar5 == 0x22)) goto LAB_001030cc;
    if (*piVar5 == 0) {
      *piVar5 = iVar3;
    }
    lVar8 = 0x16;
    uVar7 = extraout_RDX_02;
    local_a8 = lVar9;
    do {
      Tools::Char2Hex_abi_cxx11_(&local_d0,(Tools *)(ulong)imageInfo[lVar8],(uchar)uVar7);
      std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p)
      ;
      uVar7 = extraout_RDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
        uVar7 = extraout_RDX_04;
      }
      __nptr = local_a0;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x1a);
    iVar3 = *piVar5;
    *piVar5 = 0;
    local_b0 = strtol(local_a0,(char **)&local_d0,0x10);
    if (local_d0._M_dataplus._M_p != __nptr) {
      if (0xfffffffeffffffff < local_b0 - 0x80000000U) {
        if (*piVar5 != 0x22) {
          if (*piVar5 == 0) {
            *piVar5 = iVar3;
          }
          local_d0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"yuv","");
          psVar2 = local_38;
          std::__cxx11::string::substr((ulong)&local_60,(ulong)local_38);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_60,local_58);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          if (local_60 != local_50) {
            operator_delete(local_60);
          }
          std::__cxx11::string::substr((ulong)&local_60,(ulong)psVar2);
          bVar10 = false;
          if (local_58 == local_d0._M_string_length) {
            if (local_58 == 0) {
              bVar10 = true;
            }
            else {
              iVar3 = bcmp(local_60,local_d0._M_dataplus._M_p,local_58);
              bVar10 = iVar3 == 0;
            }
          }
          if (local_60 != local_50) {
            operator_delete(local_60);
          }
          pFVar4 = local_40;
          dataSize = (uint)((int)local_a8 * (int)local_b0 * 3) >> bVar10;
          fseek(local_40,0x36,0);
          data = (uchar *)operator_new__((ulong)dataSize);
          fread(data,1,(ulong)dataSize,pFVar4);
          fclose(pFVar4);
          this = (Image *)operator_new(0x20);
          Image::Image(this,imageInfo,data,(uint)local_a8,(uint)local_b0,dataSize);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if (local_a0 != local_90) {
            operator_delete(local_a0);
          }
          if (local_80 != local_70) {
            operator_delete(local_80);
          }
          return this;
        }
      }
      goto LAB_001030e4;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_001030e4:
  uVar7 = std::__throw_out_of_range("stoi");
  operator_delete(__nptr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

Image * ImageIO::readImage(string & fileName){
	FILE * imageFile = fopen(fileName.c_str(), "rb+");	
	if(imageFile == nullptr){
		cout<<"空文件"<<endl;
		exit(EXIT_FAILURE);
	}

	//读文件头
	uchar * imageInfo = new uchar[imageInfoHeadSize];
	fread(imageInfo, sizeof(uchar), imageInfoHeadSize, imageFile);


	uint width, height, dataSize;
	string imageWidthStr, imageHeightStr;

	for(int i = imageWidthPosition; i < imageWidthPosition + 4; i++){
		imageWidthStr.insert(0, Tools::Char2Hex(imageInfo[i]));
	}
	width = stoi(imageWidthStr, nullptr, 16);

	for(int i = imageHeightPosition; i < imageHeightPosition + 4; i++){
		imageHeightStr.insert(0, Tools::Char2Hex(imageInfo[i]));
	}
	height = stoi(imageHeightStr, nullptr, 16);

	string bmpStr = "yuv";
	cout<<fileName.substr(fileName.length()-3, 3)<<endl;
	if(fileName.substr(fileName.length()-3, 3) == bmpStr){
		dataSize = (width * height * 3) / 2;
	}else{
		dataSize = width * height * 3;
	}
	
	//cout<<"dataSize:"<<dataSize<<endl;

	//读图像数据
	fseek(imageFile, imageInfoHeadSize, 0);
	uchar * data = new uchar[dataSize];
	fread(data, sizeof(uchar), dataSize, imageFile);
	fclose(imageFile);

	Image * image = new Image(imageInfo, data, width, height, dataSize);

	return image;
}